

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O0

void anon_unknown.dwarf_101d8b::Flanger_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  undefined4 *in_RDX;
  uint in_ESI;
  long in_RDI;
  
  switch(in_ESI) {
  case 3:
    *in_RDX = *(undefined4 *)(in_RDI + 8);
    break;
  case 4:
    *in_RDX = *(undefined4 *)(in_RDI + 0xc);
    break;
  case 5:
    *in_RDX = *(undefined4 *)(in_RDI + 0x10);
    break;
  case 6:
    *in_RDX = *(undefined4 *)(in_RDI + 0x14);
    break;
  default:
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid flanger float property 0x%04x",(ulong)in_ESI);
    __cxa_throw(this,&effect_exception::typeinfo,effect_exception::~effect_exception);
  }
  return;
}

Assistant:

void Flanger_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_FLANGER_RATE:
        *val = props->Chorus.Rate;
        break;

    case AL_FLANGER_DEPTH:
        *val = props->Chorus.Depth;
        break;

    case AL_FLANGER_FEEDBACK:
        *val = props->Chorus.Feedback;
        break;

    case AL_FLANGER_DELAY:
        *val = props->Chorus.Delay;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid flanger float property 0x%04x", param};
    }
}